

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxRowRatio(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *__return_storage_ptr__,
             SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *lp)

{
  undefined8 *puVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  Real eps;
  bool bVar3;
  type_conflict5 tVar4;
  double *pdVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_01;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  Item *pIVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_138;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,0.0,(type *)0x0);
  for (lVar7 = 0;
      lVar7 < (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum; lVar7 = lVar7 + 1) {
    pIVar6 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.theitem +
             (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[lVar7].idx;
    pdVar5 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_128,*pdVar5,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_e8,0.0,(type *)0x0);
    lVar8 = 0x30;
    arg = extraout_RDX;
    for (lVar9 = 0;
        lVar9 < (pIVar6->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused; lVar9 = lVar9 + 1) {
      pNVar2 = (pIVar6->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      local_48 = *(undefined8 *)((long)&(pNVar2->val).m_backend.data + lVar8 + -0x10);
      puVar1 = (undefined8 *)((long)&(pNVar2->val).m_backend.data + lVar8 + -0x30);
      local_68 = *puVar1;
      uStack_60 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pNVar2->val).m_backend.data + lVar8 + -0x20);
      local_58 = *puVar1;
      uStack_50 = puVar1[1];
      local_40 = *(undefined4 *)((long)&(pNVar2->val).m_backend.data + lVar8 + -8);
      local_3c = *(undefined1 *)((long)&(pNVar2->val).m_backend.data + lVar8 + -4);
      local_38 = *(undefined8 *)((long)&(pNVar2->val).m_backend.data + lVar8);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&p,(multiprecision *)&local_68,arg);
      local_a8.m_backend.data._M_elems[9]._1_3_ = p.m_backend.data._M_elems[9]._1_3_;
      local_a8.m_backend.data._M_elems._32_5_ = p.m_backend.data._M_elems._32_5_;
      local_a8.m_backend.data._M_elems[7]._1_3_ = p.m_backend.data._M_elems[7]._1_3_;
      local_a8.m_backend.data._M_elems._24_5_ = p.m_backend.data._M_elems._24_5_;
      local_a8.m_backend.data._M_elems[4] = p.m_backend.data._M_elems[4];
      local_a8.m_backend.data._M_elems[5] = p.m_backend.data._M_elems[5];
      local_a8.m_backend.data._M_elems[0] = p.m_backend.data._M_elems[0];
      local_a8.m_backend.data._M_elems[1] = p.m_backend.data._M_elems[1];
      local_a8.m_backend.data._M_elems[2] = p.m_backend.data._M_elems[2];
      local_a8.m_backend.data._M_elems[3] = p.m_backend.data._M_elems[3];
      local_a8.m_backend.exp = p.m_backend.exp;
      local_a8.m_backend.neg = p.m_backend.neg;
      local_a8.m_backend.fpclass = p.m_backend.fpclass;
      local_a8.m_backend.prec_elem = p.m_backend.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_138,
                 &(this->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      eps = Tolerances::epsilon(local_138._M_ptr);
      bVar3 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_a8,eps);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
      arg = extraout_RDX_00;
      if (!bVar3) {
        tVar4 = boost::multiprecision::operator<
                          (&p,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_128);
        if (tVar4) {
          local_128.data._M_elems[9]._1_3_ = p.m_backend.data._M_elems[9]._1_3_;
          local_128.data._M_elems._32_5_ = p.m_backend.data._M_elems._32_5_;
          local_128.data._M_elems[7]._1_3_ = p.m_backend.data._M_elems[7]._1_3_;
          local_128.data._M_elems._24_5_ = p.m_backend.data._M_elems._24_5_;
          local_128.data._M_elems[4] = p.m_backend.data._M_elems[4];
          local_128.data._M_elems[5] = p.m_backend.data._M_elems[5];
          local_128.data._M_elems[0] = p.m_backend.data._M_elems[0];
          local_128.data._M_elems[1] = p.m_backend.data._M_elems[1];
          local_128.data._M_elems[2] = p.m_backend.data._M_elems[2];
          local_128.data._M_elems[3] = p.m_backend.data._M_elems[3];
          local_128.exp = p.m_backend.exp;
          local_128.neg = p.m_backend.neg;
          local_128.fpclass = p.m_backend.fpclass;
          local_128.prec_elem = p.m_backend.prec_elem;
        }
        tVar4 = boost::multiprecision::operator>
                          (&p,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_e8);
        arg = extraout_RDX_01;
        if (tVar4) {
          local_e8.data._M_elems[9]._1_3_ = p.m_backend.data._M_elems[9]._1_3_;
          local_e8.data._M_elems._32_5_ = p.m_backend.data._M_elems._32_5_;
          local_e8.data._M_elems[7]._1_3_ = p.m_backend.data._M_elems[7]._1_3_;
          local_e8.data._M_elems._24_5_ = p.m_backend.data._M_elems._24_5_;
          local_e8.data._M_elems[4] = p.m_backend.data._M_elems[4];
          local_e8.data._M_elems[5] = p.m_backend.data._M_elems[5];
          local_e8.data._M_elems[0] = p.m_backend.data._M_elems[0];
          local_e8.data._M_elems[1] = p.m_backend.data._M_elems[1];
          local_e8.data._M_elems[2] = p.m_backend.data._M_elems[2];
          local_e8.data._M_elems[3] = p.m_backend.data._M_elems[3];
          local_e8.exp = p.m_backend.exp;
          local_e8.neg = p.m_backend.neg;
          local_e8.fpclass = p.m_backend.fpclass;
          local_e8.prec_elem = p.m_backend.prec_elem;
        }
      }
      lVar8 = lVar8 + 0x3c;
    }
    pdVar5 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&p.m_backend,*pdVar5,(type *)0x0);
    bVar3 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_128,&p);
    if (!bVar3) {
      p.m_backend.fpclass = cpp_dec_float_finite;
      p.m_backend.prec_elem = 10;
      p.m_backend.data._M_elems[0] = 0;
      p.m_backend.data._M_elems[1] = 0;
      p.m_backend.data._M_elems[2] = 0;
      p.m_backend.data._M_elems[3] = 0;
      p.m_backend.data._M_elems[4] = 0;
      p.m_backend.data._M_elems[5] = 0;
      p.m_backend.data._M_elems._24_5_ = 0;
      p.m_backend.data._M_elems[7]._1_3_ = 0;
      p.m_backend.data._M_elems._32_5_ = 0;
      p.m_backend.data._M_elems[9]._1_3_ = 0;
      p.m_backend.exp = 0;
      p.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&p.m_backend,&local_e8,&local_128);
      tVar4 = boost::multiprecision::operator>(&p,__return_storage_ptr__);
      if (tVar4) {
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             CONCAT35(p.m_backend.data._M_elems[9]._1_3_,p.m_backend.data._M_elems._32_5_);
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             p.m_backend.data._M_elems._16_8_;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             CONCAT35(p.m_backend.data._M_elems[7]._1_3_,p.m_backend.data._M_elems._24_5_);
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             p.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             p.m_backend.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = p.m_backend.exp;
        (__return_storage_ptr__->m_backend).neg = p.m_backend.neg;
        (__return_storage_ptr__->m_backend).fpclass = p.m_backend.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = p.m_backend.prec_elem;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::maxRowRatio(const SPxLPBase<R>& lp) const
{

   R pmax = 0.0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& vec  = lp.rowVector(i);
      R           mini = R(infinity);
      R           maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         R x = spxAbs(vec.value(j));

         if(isZero(x, this->tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}